

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1aacf::IDLExportVisitor::visit_
          (IDLExportVisitor *this,Compound *type,Field *field)

{
  ostream *poVar1;
  Type *type_00;
  string sStack_68;
  string local_48;
  
  poVar1 = std::operator<<((ostream *)&this->m_stream,(string *)&this->m_indent);
  type_00 = (Type *)Typelib::Field::getType();
  Typelib::Field::getName_abi_cxx11_();
  getIDLAbsolute(&sStack_68,this,type_00,&local_48);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_68);
  std::operator<<(poVar1,";\n");
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return true;
}

Assistant:

bool IDLExportVisitor::visit_(Compound const& type, Field const& field)
    {
        m_stream
            << m_indent
            << getIDLAbsolute(field.getType(), field.getName())
            << ";\n";

        return true;
    }